

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O3

int sdsll2str(char *s,longlong value)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  bool bVar6;
  
  pbVar3 = (byte *)s;
  uVar5 = -value;
  if (0 < value) {
    uVar5 = value;
  }
  do {
    pbVar2 = pbVar3;
    *pbVar2 = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
    pbVar3 = pbVar2 + 1;
    bVar6 = 9 < uVar5;
    uVar5 = uVar5 / 10;
  } while (bVar6);
  if (value < 0) {
    *pbVar3 = 0x2d;
    pbVar3 = pbVar2 + 2;
  }
  *pbVar3 = 0;
  pbVar2 = pbVar3 + -1;
  if (s < pbVar2) {
    pbVar4 = (byte *)(s + 1);
    do {
      bVar1 = pbVar4[-1];
      pbVar4[-1] = *pbVar2;
      *pbVar2 = bVar1;
      pbVar2 = pbVar2 + -1;
      bVar6 = pbVar4 < pbVar2;
      pbVar4 = pbVar4 + 1;
    } while (bVar6);
  }
  return (int)pbVar3 - (int)s;
}

Assistant:

int sdsll2str(char *s, long long value) {
    char *p, aux;
    unsigned long long v;
    size_t l;

    /* Generate the string representation, this method produces
     * an reversed string. */
    v = (value < 0) ? -value : value;
    p = s;
    do {
        *p++ = '0'+(v%10);
        v /= 10;
    } while(v);
    if (value < 0) *p++ = '-';

    /* Compute length and add null term. */
    l = p-s;
    *p = '\0';

    /* Reverse the string. */
    p--;
    while(s < p) {
        aux = *s;
        *s = *p;
        *p = aux;
        s++;
        p--;
    }
    return l;
}